

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTableInitExpr
          (BinaryReaderIR *this,Index segment,Index table_index)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_108;
  _Head_base<0UL,_wabt::Expr_*,_false> local_100;
  Location local_f8;
  Location local_d8;
  Var local_b8;
  Var local_70;
  
  local_d8.field_1.field_0.line = 0;
  local_d8.field_1._4_8_ = 0;
  local_d8.filename.data_ = (char *)0x0;
  local_d8.filename.size_._0_4_ = 0;
  local_d8.filename.size_._4_4_ = 0;
  Var::Var(&local_70,segment,&local_d8);
  local_f8.field_1.field_0.line = 0;
  local_f8.field_1._4_8_ = 0;
  local_f8.filename.data_ = (char *)0x0;
  local_f8.filename.size_._0_4_ = 0;
  local_f8.filename.size_._4_4_ = 0;
  Var::Var(&local_b8,table_index,&local_f8);
  MakeUnique<wabt::TableInitExpr,wabt::Var,wabt::Var>((wabt *)&local_108,&local_70,&local_b8);
  local_100._M_head_impl = local_108;
  local_108 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_100);
  if (local_100._M_head_impl != (Expr *)0x0) {
    (*(local_100._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_108 != (Expr *)0x0) {
    (**(code **)(*(long *)local_108 + 8))();
  }
  local_108 = (Expr *)0x0;
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableInitExpr(Index segment, Index table_index) {
  return AppendExpr(MakeUnique<TableInitExpr>(Var(segment), Var(table_index)));
}